

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# a_firedemon.cpp
# Opt level: O1

int AF_A_FiredSplotch(VMFrameStack *stack,VMValue *param,int numparam,VMReturn *ret,int numret)

{
  VM_UBYTE VVar1;
  undefined8 *puVar2;
  undefined8 *puVar3;
  PClass *pPVar4;
  uint uVar5;
  undefined8 uVar6;
  PClass *pPVar7;
  PClassActor *pPVar8;
  AActor *pAVar9;
  char *__assertion;
  bool bVar10;
  FName local_44;
  DVector3 local_40;
  
  pPVar4 = AActor::RegistrationInfo.MyClass;
  if (numparam < 1) {
    __assertion = "(paramnum) < numparam";
    goto LAB_005b5cff;
  }
  if (((param->field_0).field_3.Type == '\x03') &&
     (((param->field_0).field_1.atag == 1 || ((param->field_0).field_1.a == (void *)0x0)))) {
    puVar2 = (undefined8 *)(param->field_0).field_1.a;
    if (puVar2 != (undefined8 *)0x0) {
      if (puVar2[1] == 0) {
        uVar6 = (**(code **)*puVar2)(puVar2);
        puVar2[1] = uVar6;
      }
      pPVar7 = (PClass *)puVar2[1];
      bVar10 = pPVar7 != (PClass *)0x0;
      if (pPVar7 != pPVar4 && bVar10) {
        do {
          pPVar7 = pPVar7->ParentClass;
          bVar10 = pPVar7 != (PClass *)0x0;
          if (pPVar7 == pPVar4) break;
        } while (pPVar7 != (PClass *)0x0);
      }
      if (!bVar10) {
        __assertion = "self == NULL || self->IsKindOf(RUNTIME_CLASS(AActor))";
        goto LAB_005b5cff;
      }
    }
    pPVar4 = AActor::RegistrationInfo.MyClass;
    if ((numparam != 1) && (VVar1 = param[1].field_0.field_3.Type, VVar1 != 0xff)) {
      if ((VVar1 != '\x03') ||
         ((param[1].field_0.field_1.atag != 1 && (param[1].field_0.field_1.a != (void *)0x0))))
      goto LAB_005b5cd4;
      puVar3 = (undefined8 *)param[1].field_0.field_1.a;
      if (puVar3 != (undefined8 *)0x0) {
        if (puVar3[1] == 0) {
          uVar6 = (**(code **)*puVar3)(puVar3);
          puVar3[1] = uVar6;
        }
        pPVar7 = (PClass *)puVar3[1];
        bVar10 = pPVar7 != (PClass *)0x0;
        if (pPVar7 != pPVar4 && bVar10) {
          do {
            pPVar7 = pPVar7->ParentClass;
            bVar10 = pPVar7 != (PClass *)0x0;
            if (pPVar7 == pPVar4) break;
          } while (pPVar7 != (PClass *)0x0);
        }
        if (!bVar10) {
          __assertion = "stateowner == NULL || stateowner->IsKindOf(RUNTIME_CLASS(AActor))";
          goto LAB_005b5cff;
        }
      }
    }
    if (((numparam < 3) || (VVar1 = param[2].field_0.field_3.Type, VVar1 == 0xff)) ||
       ((VVar1 == '\x03' &&
        ((param[2].field_0.field_1.atag == 8 || (param[2].field_0.field_1.a == (void *)0x0)))))) {
      local_44.Index = FName::NameManager::FindName(&FName::NameData,"FireDemonSplotch1",false);
      local_40.X = (double)puVar2[9];
      local_40.Y = (double)puVar2[10];
      local_40.Z = (double)puVar2[0xb];
      pPVar8 = ClassForSpawn(&local_44);
      pAVar9 = AActor::StaticSpawn(pPVar8,&local_40,ALLOW_REPLACE,false);
      if (pAVar9 != (AActor *)0x0) {
        uVar5 = FRandom::GenRand32(&pr_firedemonsplotch);
        (pAVar9->Vel).X = (double)(int)((uVar5 & 0xff) - 0x80) * 0.03125;
        uVar5 = FRandom::GenRand32(&pr_firedemonsplotch);
        (pAVar9->Vel).Y = (double)(int)((uVar5 & 0xff) - 0x80) * 0.03125;
        uVar5 = FRandom::GenRand32(&pr_firedemonsplotch);
        (pAVar9->Vel).Z = (double)(uVar5 & 0xff) * 0.015625 + 3.0;
      }
      local_44.Index = FName::NameManager::FindName(&FName::NameData,"FireDemonSplotch2",false);
      local_40.X = (double)puVar2[9];
      local_40.Y = (double)puVar2[10];
      local_40.Z = (double)puVar2[0xb];
      pPVar8 = ClassForSpawn(&local_44);
      pAVar9 = AActor::StaticSpawn(pPVar8,&local_40,ALLOW_REPLACE,false);
      if (pAVar9 != (AActor *)0x0) {
        uVar5 = FRandom::GenRand32(&pr_firedemonsplotch);
        (pAVar9->Vel).X = (double)(int)((uVar5 & 0xff) - 0x80) * 0.03125;
        uVar5 = FRandom::GenRand32(&pr_firedemonsplotch);
        (pAVar9->Vel).Y = (double)(int)((uVar5 & 0xff) - 0x80) * 0.03125;
        uVar5 = FRandom::GenRand32(&pr_firedemonsplotch);
        (pAVar9->Vel).Z = (double)(uVar5 & 0xff) * 0.015625 + 3.0;
      }
      return 0;
    }
    __assertion = 
    "param[paramnum].Type == REGT_POINTER && (param[paramnum].atag == ATAG_STATEINFO || param[paramnum].a == NULL)"
    ;
  }
  else {
LAB_005b5cd4:
    __assertion = 
    "param[paramnum].Type == REGT_POINTER && (param[paramnum].atag == ATAG_OBJECT || param[paramnum].a == NULL)"
    ;
  }
LAB_005b5cff:
  __assert_fail(__assertion,
                "/workspace/llm4binary/github/license_c_cmakelists/alexey-lysiuk[P]gzdoom/src/g_hexen/a_firedemon.cpp"
                ,0xe5,"int AF_A_FiredSplotch(VMFrameStack *, VMValue *, int, VMReturn *, int)");
}

Assistant:

DEFINE_ACTION_FUNCTION(AActor, A_FiredSplotch)
{
	PARAM_ACTION_PROLOGUE;

	AActor *mo;

	mo = Spawn ("FireDemonSplotch1", self->Pos(), ALLOW_REPLACE);
	if (mo)
	{
		mo->Vel.X = (pr_firedemonsplotch() - 128) / 32.;
		mo->Vel.Y = (pr_firedemonsplotch() - 128) / 32.;
		mo->Vel.Z = (pr_firedemonsplotch() / 64.) + 3;
	}
	mo = Spawn ("FireDemonSplotch2", self->Pos(), ALLOW_REPLACE);
	if (mo)
	{
		mo->Vel.X = (pr_firedemonsplotch() - 128) / 32.;
		mo->Vel.Y = (pr_firedemonsplotch() - 128) / 32.;
		mo->Vel.Z = (pr_firedemonsplotch() / 64.) + 3;
	}
	return 0;
}